

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall
tchecker::system::system_t::add_location
          (system_t *this,process_id_t pid,string *name,attributes_t *attributes)

{
  bool bVar1;
  invalid_argument *this_00;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = processes_t::is_process(&this->super_processes_t,pid);
  if (bVar1) {
    locs_t::add_location(&this->super_locs_t,pid,name,attributes);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_80,pid);
  std::operator+(&local_60,"Process ",&local_80);
  std::operator+(&local_40,&local_60," is not declared");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void system_t::add_location(tchecker::process_id_t pid, std::string const & name,
                            tchecker::system::attributes_t const & attributes)
{
  if (!tchecker::system::processes_t::is_process(pid))
    throw std::invalid_argument("Process " + std::to_string(pid) + " is not declared");
  tchecker::system::locs_t::add_location(pid, name, attributes);
}